

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_68 [6];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  float local_38;
  float local_34;
  undefined8 local_30;
  
  (*gl3wProcs.ptr[0x96])(0xbe2);
  (*gl3wProcs.ptr[0x1e])(0x8006);
  (*gl3wProcs.ptr[0x22])(0x302,0x303);
  (*gl3wProcs.ptr[0x7d])(0xb44);
  (*gl3wProcs.ptr[0x7d])(0xb71);
  (*gl3wProcs.ptr[0x96])(0xc11);
  (*gl3wProcs.ptr[0x176])(0x408,0x1b02);
  (*gl3wProcs.ptr[0x28c])(0,0,(ulong)(uint)fb_width,(ulong)(uint)fb_height);
  fVar1 = (draw_data->DisplayPos).x;
  fVar2 = (draw_data->DisplayPos).y;
  fVar3 = (draw_data->DisplaySize).x + fVar1;
  fVar4 = (draw_data->DisplaySize).y + fVar2;
  local_68[0] = 2.0 / (fVar3 - fVar1);
  local_68[5] = 2.0 / (fVar2 - fVar4);
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0xbf800000;
  local_38 = (fVar1 + fVar3) / (fVar1 - fVar3);
  local_34 = (fVar2 + fVar4) / (fVar4 - fVar2);
  local_30 = 0x3f80000000000000;
  (*gl3wProcs.ptr[0x22f])((ulong)g_ShaderHandle);
  (*gl3wProcs.ptr[0x1fd])((ulong)(uint)g_AttribLocationTex,0);
  (*gl3wProcs.ptr[0x227])((ulong)(uint)g_AttribLocationProjMtx,1,0,local_68);
  (*gl3wProcs.ptr[0x14])(0,0);
  (*gl3wProcs.ptr[0x1a])((ulong)vertex_array_object);
  (*gl3wProcs.ptr[8])(0x8892,(ulong)g_VboHandle);
  (*gl3wProcs.ptr[8])(0x8893,(ulong)g_ElementsHandle);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxPos);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxUV);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxColor);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxPos,2,0x1406,0,0x14,0);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxUV,2,0x1406,0,0x14,8);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxColor,4,0x1401,1,0x14,0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
    glEnableVertexAttribArray(g_AttribLocationVtxPos);
    glEnableVertexAttribArray(g_AttribLocationVtxUV);
    glEnableVertexAttribArray(g_AttribLocationVtxColor);
    glVertexAttribPointer(g_AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}